

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O0

error __thiscall memory::address<true,30,22,2>(memory *this,context *ctx,token *token,opcode *op)

{
  opcode *this_00;
  int iVar1;
  ulong uVar2;
  uint64_t uVar3;
  token local_110;
  byte local_e1;
  token local_e0;
  byte local_b1;
  ulong local_b0;
  uint64_t value;
  int64_t max;
  int64_t min;
  undefined1 local_90 [4];
  int is_zero_reg;
  token local_88;
  byte local_59;
  undefined1 local_58 [7];
  uint8_t regster;
  _Storage<context::program_type,_true> local_30;
  byte local_29;
  opcode *local_28;
  opcode *op_local;
  token *token_local;
  context *ctx_local;
  error *tmpres___LINE__;
  
  local_29 = 0;
  local_28 = op;
  op_local = (opcode *)token;
  token_local = (token *)ctx;
  ctx_local = (context *)this;
  confirm_type((token *)this,(token_type)token);
  local_30._M_value._0_1_ = error::operator_cast_to_bool((error *)this);
  if ((bool)local_30._M_value._0_1_) {
    local_29 = 1;
  }
  local_30._M_value._1_3_ = 0;
  if ((local_29 & 1) == 0) {
    error::~error((error *)this);
  }
  if (local_30._M_value == vertex) {
    context::tokenize((token *)local_58,(context *)token_local);
    memcpy(op_local,local_58,0x24);
    local_59 = 0xff;
    if (op_local[1].reuse == 2) {
      local_59 = (byte)op_local->reuse;
      context::tokenize(&local_88,(context *)token_local);
      memcpy(op_local,&local_88,0x24);
      try_reuse((context *)local_90,token_local,op_local,(int)local_28);
      error::~error((error *)local_90);
    }
    opcode::add_bits(local_28,(ulong)local_59 << 8);
    if (op_local[1].reuse == 4) {
      min._4_4_ = (uint)(local_59 == 0xff);
      iVar1 = -0x200000;
      if (min._4_4_ != 0) {
        iVar1 = 0;
      }
      max = (int64_t)iVar1;
      iVar1 = 0x15;
      if (min._4_4_ != 0) {
        iVar1 = 0x16;
      }
      value = max_bits(iVar1);
      local_b1 = 0;
      convert_integer((token *)this,(int64_t)op_local,max,(uint64_t *)value);
      local_30._M_value._0_1_ = error::operator_cast_to_bool((error *)this);
      if ((bool)local_30._M_value._0_1_) {
        local_b1 = 1;
      }
      local_30._M_value._1_3_ = 0;
      if ((local_b1 & 1) == 0) {
        error::~error((error *)this);
      }
      this_00 = local_28;
      if (local_30._M_value != vertex) {
        return (unique_ptr<char[],_std::default_delete<char[]>_>)
               (unique_ptr<char[],_std::default_delete<char[]>_>)this;
      }
      uVar2 = local_b0 >> 2;
      local_b0 = uVar2;
      uVar3 = max_bits(0x16);
      opcode::add_bits(this_00,(uVar2 & uVar3) << 0x1e);
      context::tokenize(&local_e0,(context *)token_local);
      memcpy(op_local,&local_e0,0x24);
    }
    local_e1 = 0;
    confirm_type((token *)this,(token_type)op_local);
    local_30._M_value._0_1_ = error::operator_cast_to_bool((error *)this);
    if ((bool)local_30._M_value._0_1_) {
      local_e1 = 1;
    }
    local_30._M_value._1_3_ = 0;
    if ((local_e1 & 1) == 0) {
      error::~error((error *)this);
    }
    if (local_30._M_value == vertex) {
      context::tokenize(&local_110,(context *)token_local);
      memcpy(op_local,&local_110,0x24);
      memset(this,0,8);
      error::error((error *)this);
    }
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)this;
}

Assistant:

DEFINE_OPERAND(address)
    {
        CHECK(confirm_type(token, token_type::bracket_left));

        token = ctx.tokenize();
        uint8_t regster = ZERO_REGISTER;
        if (token.type == token_type::regster) {
            regster = token.data.regster;
            token = ctx.tokenize();

            try_reuse(ctx, token, op, 8);
        }
        op.add_bits(static_cast<uint64_t>(regster) << 8);

        if constexpr (imm_offset) {
            if (token.type == token_type::immediate) {
                const int is_zero_reg = regster == ZERO_REGISTER;
                const int64_t min = is_zero_reg ? 0 : -(1 << (size - 1));
                const int64_t max = max_bits(is_zero_reg ? size : (size - 1));

                uint64_t value;
                CHECK(convert_integer(token, min, max, &value));
                value >>= shr;
                op.add_bits((value & max_bits(size)) << addr);
                token = ctx.tokenize();
            }
        }

        CHECK(confirm_type(token, token_type::bracket_right));
        token = ctx.tokenize();
        return {};
    }